

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O0

void __thiscall
QEvdevTabletHandler::QEvdevTabletHandler
          (QEvdevTabletHandler *this,QString *device,QString *spec,QObject *parent)

{
  QLatin1StringView str;
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  QMessageLogger *this_00;
  QSocketNotifier *this_01;
  ContextType *in_RCX;
  Object *in_RDX;
  QString *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  bool grabSuccess;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  mode_t in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  QEvdevTabletHandler *in_stack_fffffffffffffee8;
  QMessageLogger *in_stack_fffffffffffffef0;
  offset_in_QEvdevTabletHandler_to_subr *slot;
  Connection local_a8 [8];
  char local_a0 [16];
  ConnectionType in_stack_ffffffffffffff70;
  char local_80 [56];
  char local_48 [48];
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject(in_RDI,&in_RCX->super_QObject);
  *(undefined ***)in_RDI = &PTR_metaObject_0011c5f8;
  *(undefined4 *)(in_RDI + 0x10) = 0xffffffff;
  QString::QString((QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (QString *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  QVar4 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffee8,
                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  str.m_data = (char *)in_RDI;
  str.m_size = (qsizetype)in_stack_fffffffffffffef0;
  QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_fffffffffffffee8,str);
  QObject::setObjectName((QAnyStringView *)in_RDI);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::qLcEvdevTablet();
  anon_unknown.dwarf_5679f::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    slot = (offset_in_QEvdevTabletHandler_to_subr *)QVar4.m_data;
    if (!bVar1) break;
    anon_unknown.dwarf_5679f::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x10ed40);
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4
               ,(char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (char *)0x10ed59);
    QtPrivate::asString(in_RSI);
    uVar3 = QString::utf16();
    QMessageLogger::debug(local_48,"evdevtablet: using %ls",uVar3);
    local_10 = 0;
  }
  QString::toLocal8Bit((QString *)in_RDI);
  QByteArray::constData((QByteArray *)0x10edad);
  iVar2 = qt_safe_open((char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
  *(int *)(in_RDI + 0x10) = iVar2;
  QByteArray::~QByteArray((QByteArray *)0x10edd3);
  if (*(int *)(in_RDI + 0x10) < 0) {
    QtPrivate::asString(in_RSI);
    uVar3 = QString::utf16();
    qErrnoWarning("evdevtablet: Cannot open input device %ls",uVar3);
  }
  else {
    iVar2 = ioctl(*(int *)(in_RDI + 0x10),0x40044590,1);
    if (iVar2 == 0) {
      ioctl(*(int *)(in_RDI + 0x10),0x40044590,0);
    }
    else {
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,
                 in_stack_fffffffffffffee4,
                 (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      QtPrivate::asString(in_RSI);
      uVar3 = QString::utf16();
      QMessageLogger::warning
                (local_80,
                 "evdevtablet: %ls: The device is grabbed by another process. No events will be read."
                 ,uVar3);
    }
    this_00 = (QMessageLogger *)operator_new(0x78);
    QEvdevTabletData::QEvdevTabletData
              ((QEvdevTabletData *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (QEvdevTabletHandler *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
    ;
    *(QMessageLogger **)(in_RDI + 0x38) = this_00;
    bVar1 = queryLimits(in_stack_fffffffffffffee8);
    if (!bVar1) {
      QMessageLogger::QMessageLogger
                (this_00,(char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                 (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      QtPrivate::asString(in_RSI);
      uVar3 = QString::utf16();
      QMessageLogger::warning
                (local_a0,
                 "evdevtablet: %ls: Unset or invalid ABS limits. Behavior will be unspecified.",
                 uVar3);
    }
    this_01 = (QSocketNotifier *)operator_new(0x10);
    QSocketNotifier::QSocketNotifier(this_01,(long)*(int *)(in_RDI + 0x10),Read,in_RDI);
    *(QSocketNotifier **)(in_RDI + 0x30) = this_01;
    QObject::
    connect<void(QSocketNotifier::*)(QSocketDescriptor,QSocketNotifier::Type,QSocketNotifier::QPrivateSignal),void(QEvdevTabletHandler::*)()>
              (in_RDX,0,in_RCX,slot,in_stack_ffffffffffffff70);
    QMetaObject::Connection::~Connection(local_a8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QEvdevTabletHandler::QEvdevTabletHandler(const QString &device, const QString &spec, QObject *parent)
    : QObject(parent), m_fd(-1), m_device(device), m_notifier(0), d(0)
{
    Q_UNUSED(spec);

    setObjectName("Evdev Tablet Handler"_L1);

    qCDebug(qLcEvdevTablet, "evdevtablet: using %ls", qUtf16Printable(device));

    m_fd = QT_OPEN(device.toLocal8Bit().constData(), O_RDONLY | O_NDELAY, 0);
    if (m_fd < 0) {
        qErrnoWarning("evdevtablet: Cannot open input device %ls", qUtf16Printable(device));
        return;
    }

    bool grabSuccess = !ioctl(m_fd, EVIOCGRAB, (void *) 1);
    if (grabSuccess)
        ioctl(m_fd, EVIOCGRAB, (void *) 0);
    else
        qWarning("evdevtablet: %ls: The device is grabbed by another process. No events will be read.", qUtf16Printable(device));

    d = new QEvdevTabletData(this);
    if (!queryLimits())
        qWarning("evdevtablet: %ls: Unset or invalid ABS limits. Behavior will be unspecified.", qUtf16Printable(device));

    m_notifier = new QSocketNotifier(m_fd, QSocketNotifier::Read, this);
    connect(m_notifier, &QSocketNotifier::activated, this, &QEvdevTabletHandler::readData);
}